

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

void rlottie::internal::model::PathData::lerp(PathData *start,PathData *end,float t,VPath *result)

{
  bool bVar1;
  unsigned_long *puVar2;
  const_reference p1;
  const_reference c2;
  const_reference c1;
  VPath *in_RDX;
  vector<VPointF,_std::allocator<VPointF>_> *in_RSI;
  VPointF *pVVar3;
  vector<VPointF,_std::allocator<VPointF>_> *in_RDI;
  undefined4 in_XMM0_Da;
  size_t i;
  unsigned_long size;
  VPointF *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  VPointF *in_stack_fffffffffffffef8;
  vector<VPointF,_std::allocator<VPointF>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar5;
  VPointF local_60;
  ulong local_58;
  VPointF local_50;
  VPointF local_48;
  VPointF local_40;
  size_type local_38;
  size_type local_30;
  unsigned_long local_28;
  VPath *local_20;
  undefined4 local_14;
  vector<VPointF,_std::allocator<VPointF>_> *local_10;
  vector<VPointF,_std::allocator<VPointF>_> *local_8;
  
  local_20 = in_RDX;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VPath::reset((VPath *)0x172fc5);
  bVar1 = std::vector<VPointF,_std::allocator<VPointF>_>::empty(in_stack_ffffffffffffff00);
  if ((!bVar1) &&
     (bVar1 = std::vector<VPointF,_std::allocator<VPointF>_>::empty(in_stack_ffffffffffffff00),
     !bVar1)) {
    local_30 = std::vector<VPointF,_std::allocator<VPointF>_>::size(local_8);
    local_38 = std::vector<VPointF,_std::allocator<VPointF>_>::size(local_10);
    puVar2 = std::min<unsigned_long>(&local_30,&local_38);
    local_28 = *puVar2;
    VPath::reserve((VPath *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (size_t)in_stack_fffffffffffffee8,0x173067);
    std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_8,0);
    std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_10,0);
    std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_8,0);
    local_50 = ::operator-(in_stack_fffffffffffffee8,(VPointF *)0x1730d4);
    local_48 = ::operator*((float)((ulong)in_stack_fffffffffffffee8 >> 0x20),(VPointF *)0x1730f3);
    local_40 = ::operator+(in_stack_fffffffffffffee8,(VPointF *)0x17310e);
    pVVar3 = &local_40;
    VPath::moveTo((VPath *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    for (local_58 = 1; local_58 < local_28; local_58 = local_58 + 3) {
      std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_8,local_58);
      p1 = std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_10,local_58);
      std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_8,local_58);
      ::operator-(p1,(VPointF *)0x1731bb);
      ::operator*((float)((ulong)p1 >> 0x20),(VPointF *)0x1731da);
      local_60 = ::operator+(p1,(VPointF *)0x1731f5);
      c2 = std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_8,local_58 + 1);
      uVar4 = local_14;
      std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_10,local_58 + 1);
      std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_8,local_58 + 1);
      ::operator-(p1,(VPointF *)0x17326c);
      ::operator*((float)((ulong)p1 >> 0x20),(VPointF *)0x17328b);
      ::operator+(p1,(VPointF *)0x1732a6);
      std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_8,local_58 + 2);
      uVar5 = local_14;
      c1 = std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_10,local_58 + 2);
      std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_8,local_58 + 2);
      ::operator-(p1,(VPointF *)0x173320);
      ::operator*((float)((ulong)p1 >> 0x20),(VPointF *)0x173339);
      ::operator+(p1,(VPointF *)0x173354);
      pVVar3 = &local_60;
      VPath::cubicTo((VPath *)CONCAT44(uVar5,in_stack_ffffffffffffff20),c1,c2,
                     (VPointF *)CONCAT44(uVar4,in_stack_ffffffffffffff08));
    }
    if (((ulong)local_8[1].super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                super__Vector_impl_data._M_start & 1) != 0) {
      VPath::close(local_20,(int)pVVar3);
    }
  }
  return;
}

Assistant:

static void lerp(const PathData &start, const PathData &end, float t,
                     VPath &result)
    {
        result.reset();
        // test for empty animation data.
        if (start.mPoints.empty() || end.mPoints.empty())
        {
            return;
        }
        auto size = std::min(start.mPoints.size(), end.mPoints.size());
        /* reserve exact memory requirement at once
         * ptSize = size + 1(size + close)
         * elmSize = size/3 cubic + 1 move + 1 close
         */
        result.reserve(size + 1, size / 3 + 2);
        result.moveTo(start.mPoints[0] +
                      t * (end.mPoints[0] - start.mPoints[0]));
        for (size_t i = 1; i < size; i += 3) {
            result.cubicTo(
                start.mPoints[i] + t * (end.mPoints[i] - start.mPoints[i]),
                start.mPoints[i + 1] +
                    t * (end.mPoints[i + 1] - start.mPoints[i + 1]),
                start.mPoints[i + 2] +
                    t * (end.mPoints[i + 2] - start.mPoints[i + 2]));
        }
        if (start.mClosed) result.close();
    }